

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiStyleVarInfo *pIVar3;
  ImGuiStyleMod local_2c;
  
  pIVar3 = GetStyleVarInfo(idx);
  pIVar2 = GImGui;
  if ((pIVar3->Type == 8) && (pIVar3->Count == 2)) {
    uVar1 = pIVar3->Offset;
    local_2c.field_1 =
         *(anon_union_8_2_f211c874_for_ImGuiStyleMod_1 *)
          ((long)&(GImGui->Style).Alpha + (ulong)uVar1);
    local_2c.VarIdx = idx;
    ImVector<ImGuiStyleMod>::push_back(&GImGui->StyleModifiers,&local_2c);
    *(ImVec2 *)((long)&(pIVar2->Style).Alpha + (ulong)uVar1) = *val;
    return;
  }
  __assert_fail("0 && \"Called PushStyleVar() ImVec2 variant but variable is not a ImVec2!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                ,0x18bc,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
}

Assistant:

void ImGui::PushStyleVar(ImGuiStyleVar idx, const ImVec2& val)
{
    const ImGuiStyleVarInfo* var_info = GetStyleVarInfo(idx);
    if (var_info->Type == ImGuiDataType_Float && var_info->Count == 2)
    {
        ImGuiContext& g = *GImGui;
        ImVec2* pvar = (ImVec2*)var_info->GetVarPtr(&g.Style);
        g.StyleModifiers.push_back(ImGuiStyleMod(idx, *pvar));
        *pvar = val;
        return;
    }
    IM_ASSERT(0 && "Called PushStyleVar() ImVec2 variant but variable is not a ImVec2!");
}